

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

size_t __thiscall spdlog::details::file_helper::size(file_helper *this)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  FILE *in_stack_00000090;
  char *in_stack_ffffffffffffffa8;
  filename_t local_48;
  string *in_stack_ffffffffffffffe0;
  
  if (in_RDI->_M_string_length == 0) {
    details::os::filename_to_str(&local_48);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    throw_spdlog_ex(in_stack_ffffffffffffffe0);
  }
  sVar1 = details::os::filesize(in_stack_00000090);
  return sVar1;
}

Assistant:

SPDLOG_INLINE size_t file_helper::size() const {
    if (fd_ == nullptr) {
        throw_spdlog_ex("Cannot use size() on closed file " + os::filename_to_str(filename_));
    }
    return os::filesize(fd_);
}